

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

uint32_t lzma_mf_bt2_find(lzma_mf *mf,lzma_match *matches)

{
  uint32_t cur_match_00;
  uint32_t pos_00;
  ushort *cur_00;
  lzma_match *plVar1;
  uint32_t local_44;
  uint32_t len_limit;
  uint32_t matches_count;
  uint32_t cur_match;
  uint32_t hash_value;
  uint32_t pos;
  uint8_t *cur;
  lzma_match *matches_local;
  lzma_mf *mf_local;
  
  local_44 = mf_avail(mf);
  if (local_44 < mf->nice_len) {
    if ((local_44 < 2) || (mf->action == LZMA_SYNC_FLUSH)) {
      if (mf->action != LZMA_RUN) {
        move_pending(mf);
        return 0;
      }
      __assert_fail("mf->action != LZMA_RUN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                    ,0x27b,"uint32_t lzma_mf_bt2_find(lzma_mf *, lzma_match *)");
    }
  }
  else {
    local_44 = mf->nice_len;
  }
  cur_00 = (ushort *)mf_ptr(mf);
  pos_00 = mf->read_pos + mf->offset;
  cur_match_00 = mf->hash[(uint)*cur_00];
  mf->hash[(uint)*cur_00] = pos_00;
  plVar1 = bt_find_func(local_44,pos_00,(uint8_t *)cur_00,cur_match_00,mf->depth,mf->son,
                        mf->cyclic_pos,mf->cyclic_size,matches,1);
  move_pos(mf);
  return (uint32_t)((long)plVar1 - (long)matches >> 3);
}

Assistant:

extern uint32_t
lzma_mf_bt2_find(lzma_mf *mf, lzma_match *matches)
{
	const uint8_t *cur;
	uint32_t pos;
	uint32_t hash_value; /* hash_2_calc */
	uint32_t cur_match;
	uint32_t matches_count = 0;

	header_find(true, 2);

	hash_2_calc();

	cur_match = mf->hash[hash_value];
	mf->hash[hash_value] = pos;

	bt_find(1);
}